

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddBranch(InstructionBuilder *this,uint32_t label_id)

{
  IRContext *c;
  Instruction *pIVar1;
  initializer_list<unsigned_int> init_list;
  uint32_t local_b4;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_b0;
  undefined4 local_a8 [2];
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  SmallVector<unsigned_int,_2UL> local_58;
  
  pIVar1 = (Instruction *)::operator_new(0x70);
  c = this->context_;
  init_list._M_len = 1;
  init_list._M_array = &local_b4;
  local_b4 = label_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_a8[0] = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,&local_58);
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_78,
             local_a8,&local_78);
  Instruction::Instruction(pIVar1,c,OpBranch,0,0,(OperandList *)&local_78);
  local_b0._M_head_impl = pIVar1;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_78);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_b0);
  if (local_b0._M_head_impl != (Instruction *)0x0) {
    (*((local_b0._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return pIVar1;
}

Assistant:

Instruction* AddBranch(uint32_t label_id) {
    std::unique_ptr<Instruction> new_branch(new Instruction(
        GetContext(), spv::Op::OpBranch, 0, 0,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {label_id}}}));
    return AddInstruction(std::move(new_branch));
  }